

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::RelationalComparisonHelper
               (Var aLeft,Var aRight,ScriptContext *scriptContext,bool leftFirst,bool undefinedAs)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  JavascriptLibrary *pJVar6;
  long lVar7;
  JavascriptTypedNumber<long> *pJVar8;
  long lVar9;
  unsigned_long uVar10;
  JavascriptTypedNumber<unsigned_long> *pJVar11;
  unsigned_long uVar12;
  undefined1 auVar13 [16];
  unsigned_long rightValue_3;
  unsigned_long leftValue_3;
  long rightValue_2;
  unsigned_long leftValue_2;
  unsigned_long rightValue_1;
  long leftValue_1;
  long rightValue;
  long leftValue;
  TypeId rightType;
  TypeId leftType;
  double dblRight;
  double dblLeft;
  TypeId typeId;
  bool undefinedAs_local;
  bool leftFirst_local;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  TypeId local_94;
  TypeId local_84;
  TypeId local_74;
  TypeId local_64;
  TypeId local_58;
  TypeId typeId_1;
  TypeId typeId_2;
  TypeId typeId_3;
  TypeId typeId_4;
  TypeId typeId_5;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aLeft);
  if (bVar2) {
    local_58 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aLeft);
    if (bVar2) {
      local_58 = TypeIds_Number;
    }
    else {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
      if (pRVar5 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_58 = RecyclableObject::GetTypeId(pRVar5);
      if ((0x57 < (int)local_58) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr();
        *puVar4 = 0;
      }
    }
  }
  if (local_58 == TypeIds_Null) {
    aRight_local = TaggedInt::ToVarUnchecked(0);
  }
  else {
    aRight_local = aLeft;
    if (local_58 == TypeIds_Undefined) {
      pJVar6 = ScriptContext::GetLibrary(scriptContext);
      aRight_local = JavascriptLibraryBase::GetNaN(&pJVar6->super_JavascriptLibraryBase);
    }
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aRight);
  if (bVar2) {
    local_64 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aRight);
    if (bVar2) {
      local_64 = TypeIds_Number;
    }
    else {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aRight);
      if (pRVar5 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_64 = RecyclableObject::GetTypeId(pRVar5);
      if ((0x57 < (int)local_64) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr();
        *puVar4 = 0;
      }
    }
  }
  if (local_64 == TypeIds_Null) {
    scriptContext_local = (ScriptContext *)TaggedInt::ToVarUnchecked(0);
  }
  else {
    scriptContext_local = (ScriptContext *)aRight;
    if (local_64 == TypeIds_Undefined) {
      pJVar6 = ScriptContext::GetLibrary(scriptContext);
      scriptContext_local =
           (ScriptContext *)JavascriptLibraryBase::GetNaN(&pJVar6->super_JavascriptLibraryBase);
    }
  }
  if (aRight_local == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aRight_local);
  if (bVar2) {
    local_74 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aRight_local);
    if (bVar2) {
      local_74 = TypeIds_Number;
    }
    else {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aRight_local);
      if (pRVar5 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_74 = RecyclableObject::GetTypeId(pRVar5);
      if ((0x57 < (int)local_74) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  if (scriptContext_local == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(scriptContext_local);
  if (bVar2) {
    local_84 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(scriptContext_local);
    if (bVar2) {
      local_84 = TypeIds_Number;
    }
    else {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(scriptContext_local);
      if (pRVar5 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_84 = RecyclableObject::GetTypeId(pRVar5);
      if ((0x57 < (int)local_84) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  if ((local_74 == TypeIds_BigInt) || (local_84 == TypeIds_BigInt)) {
    if (local_74 != local_84) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x28c,"(leftType == rightType)",
                                  "do not support comparison with types other than BigInt");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = JavascriptBigInt::LessThan(aRight_local,scriptContext_local);
    return (uint)bVar2;
  }
  switch(local_74) {
  case TypeIds_Undefined:
  case TypeIds_Null:
  case TypeIds_Boolean:
  case TypeIds_Symbol:
    dblRight = JavascriptConversion::ToNumber(aRight_local,scriptContext);
    _rightType = JavascriptConversion::ToNumber(scriptContext_local,scriptContext);
    break;
  case TypeIds_FirstNumberType:
    dblRight = TaggedInt::ToDouble(aRight_local);
    if (local_84 == TypeIds_FirstNumberType) {
      _rightType = TaggedInt::ToDouble(scriptContext_local);
    }
    else if (local_84 == TypeIds_Number) {
      _rightType = JavascriptNumber::GetValue(scriptContext_local);
    }
    else {
      _rightType = JavascriptConversion::ToNumber(scriptContext_local,scriptContext);
    }
    break;
  case TypeIds_Number:
    dblRight = JavascriptNumber::GetValue(aRight_local);
    if (local_84 == TypeIds_FirstNumberType) {
      _rightType = TaggedInt::ToDouble(scriptContext_local);
    }
    else if (local_84 == TypeIds_Number) {
      _rightType = JavascriptNumber::GetValue(scriptContext_local);
    }
    else {
      _rightType = JavascriptConversion::ToNumber(scriptContext_local,scriptContext);
    }
    break;
  case TypeIds_Int64Number:
    if (local_84 == TypeIds_Int64Number) {
      pJVar8 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight_local);
      lVar9 = JavascriptTypedNumber<long>::GetValue(pJVar8);
      pJVar8 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(scriptContext_local);
      lVar7 = JavascriptTypedNumber<long>::GetValue(pJVar8);
      return (uint)(lVar9 < lVar7);
    }
    if (local_84 == TypeIds_LastNumberType) {
      pJVar8 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight_local);
      lVar9 = JavascriptTypedNumber<long>::GetValue(pJVar8);
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(scriptContext_local);
      uVar12 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar11);
      if ((uVar12 < 0x80000000) && (-1 < lVar9)) {
        return (uint)(lVar9 < (long)uVar12);
      }
    }
    pJVar8 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight_local);
    lVar9 = JavascriptTypedNumber<long>::GetValue(pJVar8);
    dblRight = (double)lVar9;
    _rightType = JavascriptConversion::ToNumber(scriptContext_local,scriptContext);
    break;
  case TypeIds_LastNumberType:
    if (local_84 == TypeIds_Int64Number) {
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight_local);
      uVar12 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar11);
      pJVar8 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(scriptContext_local);
      lVar9 = JavascriptTypedNumber<long>::GetValue(pJVar8);
      if ((uVar12 < 0x7fffffff) && (-1 < lVar9)) {
        return (uint)((long)uVar12 < lVar9);
      }
    }
    else if (local_84 == TypeIds_LastNumberType) {
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight_local);
      uVar12 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar11);
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(scriptContext_local);
      uVar10 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar11);
      return (uint)(uVar12 < uVar10);
    }
    pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight_local);
    uVar12 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar11);
    auVar13._8_4_ = (int)(uVar12 >> 0x20);
    auVar13._0_8_ = uVar12;
    auVar13._12_4_ = 0x45300000;
    dblRight = (auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
    _rightType = JavascriptConversion::ToNumber(scriptContext_local,scriptContext);
    break;
  case TypeIds_String:
    if (2 < local_84 - TypeIds_Boolean) {
      if (local_84 == TypeIds_String) {
LAB_00f8e332:
        bVar2 = JavascriptString::LessThan(aRight_local,scriptContext_local);
        return (uint)bVar2;
      }
      scriptContext_local =
           (ScriptContext *)
           JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>
                     (scriptContext_local,scriptContext);
      if (scriptContext_local == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      bVar2 = TaggedInt::Is(scriptContext_local);
      if (bVar2) {
        local_94 = TypeIds_FirstNumberType;
      }
      else {
        bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(scriptContext_local);
        if (bVar2) {
          local_94 = TypeIds_Number;
        }
        else {
          pRVar5 = UnsafeVarTo<Js::RecyclableObject>(scriptContext_local);
          if (pRVar5 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          local_94 = RecyclableObject::GetTypeId(pRVar5);
          if ((0x57 < (int)local_94) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
        }
      }
      if (local_94 == TypeIds_String) goto LAB_00f8e332;
      JavascriptConversion::ToNumber(scriptContext_local,scriptContext);
    }
    dblRight = JavascriptConversion::ToNumber(aRight_local,scriptContext);
    _rightType = JavascriptConversion::ToNumber(scriptContext_local,scriptContext);
    break;
  default:
    if (leftFirst) {
      aRight_local = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>
                               (aRight_local,scriptContext);
      scriptContext_local =
           (ScriptContext *)
           JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>
                     (scriptContext_local,scriptContext);
    }
    else {
      scriptContext_local =
           (ScriptContext *)
           JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>
                     (scriptContext_local,scriptContext);
      aRight_local = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>
                               (aRight_local,scriptContext);
    }
    BVar3 = RelationalComparisonHelper
                      (aRight_local,scriptContext_local,scriptContext,leftFirst,undefinedAs);
    return BVar3;
  }
  BVar3 = JavascriptNumber::IsNan(dblRight);
  if ((BVar3 == 0) && (BVar3 = JavascriptNumber::IsNan(_rightType), BVar3 == 0)) {
    if ((dblRight != _rightType) || (NAN(dblRight) || NAN(_rightType))) {
      aLeft_local._4_4_ = (uint)(dblRight < _rightType);
    }
    else {
      aLeft_local._4_4_ = 0;
    }
  }
  else {
    aLeft_local._4_4_ = (uint)undefinedAs;
  }
  return aLeft_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::RelationalComparisonHelper(Var aLeft, Var aRight, ScriptContext* scriptContext, bool leftFirst, bool undefinedAs)
    {
        TypeId typeId = JavascriptOperators::GetTypeId(aLeft);

        if (typeId == TypeIds_Null)
        {
            aLeft=TaggedInt::ToVarUnchecked(0);
        }
        else if (typeId == TypeIds_Undefined)
        {
            aLeft=scriptContext->GetLibrary()->GetNaN();
        }

        typeId = JavascriptOperators::GetTypeId(aRight);

        if (typeId == TypeIds_Null)
        {
            aRight=TaggedInt::ToVarUnchecked(0);
        }
        else if (typeId == TypeIds_Undefined)
        {
            aRight=scriptContext->GetLibrary()->GetNaN();
        }

        double dblLeft, dblRight;
        TypeId leftType = JavascriptOperators::GetTypeId(aLeft);
        TypeId rightType = JavascriptOperators::GetTypeId(aRight);

        if ((leftType == TypeIds_BigInt) || (rightType == TypeIds_BigInt))
        {
            // TODO: support comparison with types other than BigInt
            AssertOrFailFastMsg(leftType == rightType, "do not support comparison with types other than BigInt");
            return JavascriptBigInt::LessThan(aLeft, aRight);
        }

        switch (leftType)
        {
        case TypeIds_Integer:
            dblLeft = TaggedInt::ToDouble(aLeft);
            switch (rightType)
            {
            case TypeIds_Integer:
                dblRight = TaggedInt::ToDouble(aRight);
                break;
            case TypeIds_Number:
                dblRight = JavascriptNumber::GetValue(aRight);
                break;
            default:
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
                break;
            }
            break;
        case TypeIds_Number:
            dblLeft = JavascriptNumber::GetValue(aLeft);
            switch (rightType)
            {
            case TypeIds_Integer:
                dblRight = TaggedInt::ToDouble(aRight);
                break;
            case TypeIds_Number:
                dblRight = JavascriptNumber::GetValue(aRight);
                break;
            default:
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
                break;
            }
            break;
        case TypeIds_Int64Number:
            {
                switch (rightType)
                {
                case TypeIds_Int64Number:
                    {
                        __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                        __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                        return leftValue < rightValue;
                    }
                    break;
                case TypeIds_UInt64Number:
                    {
                        __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                        unsigned __int64 rightValue = UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                        if (rightValue <= INT_MAX && leftValue >= 0)
                        {
                            return leftValue < (__int64)rightValue;
                        }
                    }
                    break;
                }
                dblLeft = (double)UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            }
            break;

        // we cannot do double conversion between 2 int64 numbers as we can get wrong result after conversion
        // i.e., two different numbers become the same after losing precision. We'll continue dbl comparison
        // if either number is not an int64 number.
        case TypeIds_UInt64Number:
            {
                switch (rightType)
                {
                case TypeIds_Int64Number:
                    {
                        unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                        __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                        if (leftValue < INT_MAX && rightValue >= 0)
                        {
                            return (__int64)leftValue < rightValue;
                        }
                    }
                    break;
                case TypeIds_UInt64Number:
                    {
                        unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                        unsigned __int64 rightValue = UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                        return leftValue < rightValue;
                    }
                    break;
                }
                dblLeft = (double)UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            }
            break;

        case TypeIds_String:
            switch (rightType)
            {
            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_Boolean:
                break;
            default:
                aRight = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);
                rightType = JavascriptOperators::GetTypeId(aRight);
                if (rightType != TypeIds_String)
                {
                    dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
                    break;
                }
            case TypeIds_String:
                return JavascriptString::LessThan(aLeft, aRight);
            }
            dblLeft = JavascriptConversion::ToNumber(aLeft, scriptContext);
            dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            break;
        case TypeIds_Boolean:
        case TypeIds_Null:
        case TypeIds_Undefined:
        case TypeIds_Symbol:
            dblLeft = JavascriptConversion::ToNumber(aLeft, scriptContext);
            dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            break;
        default:
            if (leftFirst)
            {
                aLeft = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aLeft, scriptContext);
                aRight = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);
            }
            else
            {
                aRight = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);
                aLeft = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aLeft, scriptContext);
            }
            //BugFix: When @@ToPrimitive of an object is overridden with a function that returns null/undefined
            //this helper will fall into a inescapable goto loop as the checks for null/undefined were outside of the path
            return RelationalComparisonHelper(aLeft, aRight, scriptContext, leftFirst, undefinedAs);
        }

        //
        // And +0,-0 that is not implemented fully
        //

        if (JavascriptNumber::IsNan(dblLeft) || JavascriptNumber::IsNan(dblRight))
        {
            return undefinedAs;
        }

        // this will succeed for -0.0 == 0.0 case as well
        if (dblLeft == dblRight)
        {
            return false;
        }

        return dblLeft < dblRight;
    }